

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int get_thread_siblings(int cpuid)

{
  int iVar1;
  uint in_EDI;
  int i;
  int nscan_1;
  int id1;
  char sep;
  int id0;
  int thread_siblings_1;
  int nscan;
  int thread_siblings;
  FILE *fp;
  char path [256];
  int local_130;
  int local_128;
  char local_121;
  int local_120;
  uint local_11c;
  FILE *local_110;
  char local_108 [256];
  uint local_8;
  uint local_4;
  
  local_8 = in_EDI;
  sprintf(local_108,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings",(ulong)in_EDI);
  local_110 = (FILE *)0x0;
  sprintf(local_108,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list",(ulong)local_8);
  local_110 = fopen(local_108,"rb");
  if (local_110 == (FILE *)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    local_11c = 0xffffffff;
    iVar1 = __isoc99_fscanf(local_110,"%d",&local_120);
    if (iVar1 == 1) {
      local_11c = 1 << ((byte)local_120 & 0x1f);
      while (iVar1 = __isoc99_fscanf(local_110,"%c%d",&local_121,&local_128), iVar1 == 2) {
        if (local_121 == ',') {
          local_11c = 1 << ((byte)local_128 & 0x1f) | local_11c;
        }
        if ((local_121 == '-') && (local_130 = local_120, local_120 < local_128)) {
          while (local_130 = local_130 + 1, local_130 <= local_128) {
            local_11c = 1 << ((byte)local_130 & 0x1f) | local_11c;
          }
        }
        local_120 = local_128;
      }
    }
    fclose(local_110);
    local_4 = local_11c;
  }
  return local_4;
}

Assistant:

static int get_thread_siblings(int cpuid)
{
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings", cpuid);

    FILE* fp = 0; //fopen(path, "rb");
    if (fp)
    {
        int thread_siblings = -1;
        int nscan = fscanf(fp, "%x", &thread_siblings);
        if (nscan != 1)
        {
            // ignore
        }

        fclose(fp);

        return thread_siblings;
    }

    // second try, parse from human-readable thread_siblings_list
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list", cpuid);

    fp = fopen(path, "rb");
    if (fp)
    {
        int thread_siblings = -1;

        int id0;
        char sep;
        int id1;

        int nscan = fscanf(fp, "%d", &id0);
        if (nscan == 1)
        {
            thread_siblings = (1 << id0);

            while (fscanf(fp, "%c%d", &sep, &id1) == 2)
            {
                if (sep == ',')
                {
                    thread_siblings |= (1 << id1);
                }
                if (sep == '-' && id0 < id1)
                {
                    for (int i = id0 + 1; i <= id1; i++)
                    {
                        thread_siblings |= (1 << i);
                    }
                }

                id0 = id1;
            }
        }
        else
        {
            // ignore
        }

        fclose(fp);

        return thread_siblings;
    }

    return -1;
}